

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O1

void __thiscall AutoFile::~AutoFile(AutoFile *this)

{
  long lVar1;
  FILE *__stream;
  pointer pbVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = (FILE *)this->m_file;
  this->m_file = (FILE *)0x0;
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
  }
  pbVar2 = (this->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pbVar2 == (pointer)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(pbVar2,(long)(this->m_xor).
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pbVar2);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~AutoFile() { fclose(); }